

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModuleRoot.cpp
# Opt level: O0

BOOL __thiscall
Js::ModuleRoot::SetAccessors
          (ModuleRoot *this,PropertyId propertyId,Var getter,Var setter,PropertyOperationFlags flags
          )

{
  BOOL BVar1;
  HostObjectBase **ppHVar2;
  HostObjectBase *pHVar3;
  ScriptContext *pSVar4;
  GlobalObject *this_00;
  GlobalObject *globalObj;
  PropertyOperationFlags flags_local;
  Var setter_local;
  Var getter_local;
  PropertyId propertyId_local;
  ModuleRoot *this_local;
  
  BVar1 = DynamicObject::SetAccessors((DynamicObject *)this,propertyId,getter,setter,flags);
  if (BVar1 == 0) {
    ppHVar2 = Memory::WriteBarrierPtr::operator_cast_to_HostObjectBase__
                        ((WriteBarrierPtr *)&(this->super_RootObjectBase).hostObject);
    if (*ppHVar2 == (HostObjectBase *)0x0) {
      pSVar4 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
      this_00 = ScriptContextBase::GetGlobalObject(&pSVar4->super_ScriptContextBase);
      this_local._4_4_ = GlobalObject::SetAccessors(this_00,propertyId,getter,setter,flags);
    }
    else {
      pHVar3 = Memory::WriteBarrierPtr<Js::HostObjectBase>::operator->
                         (&(this->super_RootObjectBase).hostObject);
      this_local._4_4_ =
           (**(code **)(*(long *)pHVar3 + 0x168))(pHVar3,propertyId,getter,setter,flags);
    }
  }
  else {
    this_local._4_4_ = 1;
  }
  return this_local._4_4_;
}

Assistant:

BOOL ModuleRoot::SetAccessors(PropertyId propertyId, Var getter, Var setter, PropertyOperationFlags flags)
    {
        if (DynamicObject::SetAccessors(propertyId, getter, setter, flags))
        {
            return TRUE;
        }
        if (this->hostObject)
        {
            return this->hostObject->SetAccessors(propertyId, getter, setter, flags);
        }

        //
        // Try checking the global object
        // if the module root doesn't have the property and the host object also doesn't have it
        //
        GlobalObject* globalObj = GetScriptContext()->GetGlobalObject();
        return globalObj->GlobalObject::SetAccessors(propertyId, getter, setter, flags);
    }